

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> * __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>::operator=
          (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *this,
          list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *r)

{
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *__name;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *r_local;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *this_local;
  
  if (this != r) {
    this->next = r->next;
    this->prev = r;
    __name = r;
    invariant_check(r);
    this->next->prev = this;
    r->next = this;
    unlink(r,(char *)__name);
    invariant_check(this);
  }
  return this;
}

Assistant:

list_elem&
    operator=(
      list_elem &&r)
    noexcept
    {
      if (this != &r)
      {
        next = r.next;
        prev = &r;
        r.invariant_check();

        next->prev = this;
        r.next = this;

        TROMPELOEIL_ASSERT(next->prev == this);
        TROMPELOEIL_ASSERT(prev->next == this);

        r.unlink();

        TROMPELOEIL_ASSERT(!r.is_linked());
        invariant_check();
      }
      return *this;
    }